

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

char * __thiscall io::LineReader::next_line(LineReader *this)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  type pcVar5;
  line_length_limit_exceeded *this_00;
  char *ret;
  undefined1 local_230 [8];
  line_length_limit_exceeded err;
  int line_end;
  LineReader *this_local;
  
  if (this->data_begin == this->data_end) {
    this_local = (LineReader *)0x0;
  }
  else {
    this->file_line = this->file_line + 1;
    if (this->data_end <= this->data_begin) {
      __assert_fail("data_begin < data_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/fast-cpp-csv-parser/csv.h"
                    ,0x1ba,"char *io::LineReader::next_line()");
    }
    if (0x2000000 < this->data_end) {
      __assert_fail("data_end <= block_len*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/fast-cpp-csv-parser/csv.h"
                    ,0x1bb,"char *io::LineReader::next_line()");
    }
    if (0xffffff < this->data_begin) {
      pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->buffer);
      pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->buffer);
      memcpy(pcVar3,pcVar4 + 0x1000000,0x1000000);
      this->data_begin = this->data_begin + -0x1000000;
      this->data_end = this->data_end + -0x1000000;
      bVar1 = detail::AsynchronousReader::is_valid(&this->reader);
      if (bVar1) {
        iVar2 = detail::AsynchronousReader::finish_read(&this->reader);
        this->data_end = iVar2 + this->data_end;
        pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->buffer);
        pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->buffer);
        memcpy(pcVar3 + 0x1000000,pcVar4 + 0x2000000,0x1000000);
        pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->buffer);
        detail::AsynchronousReader::start_read(&this->reader,pcVar3 + 0x2000000,0x1000000);
      }
    }
    err._524_4_ = this->data_begin;
    while( true ) {
      pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->buffer,(long)(int)err._524_4_);
      bVar1 = false;
      if (*pcVar5 != '\n') {
        bVar1 = err._524_4_ != this->data_end;
      }
      if (!bVar1) break;
      err._524_4_ = err._524_4_ + 1;
    }
    if (0x1000000 < (err._524_4_ - this->data_begin) + 1) {
      error::line_length_limit_exceeded::line_length_limit_exceeded
                ((line_length_limit_exceeded *)local_230);
      error::with_file_name::set_file_name
                ((with_file_name *)(err.super_base.error_message_buffer + 0xf8),this->file_name);
      error::with_file_line::set_file_line
                ((with_file_line *)(err.super_with_file_name.file_name + 0xf8),this->file_line);
      this_00 = (line_length_limit_exceeded *)__cxa_allocate_exception(0x210);
      error::line_length_limit_exceeded::line_length_limit_exceeded
                (this_00,(line_length_limit_exceeded *)local_230);
      __cxa_throw(this_00,&error::line_length_limit_exceeded::typeinfo,
                  error::line_length_limit_exceeded::~line_length_limit_exceeded);
    }
    pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       (&this->buffer,(long)(int)err._524_4_);
    if (*pcVar5 == '\n') {
      pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->buffer,(long)(int)err._524_4_);
      *pcVar5 = '\0';
    }
    else {
      this->data_end = this->data_end + 1;
      pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->buffer,(long)(int)err._524_4_);
      *pcVar5 = '\0';
    }
    if ((err._524_4_ != this->data_begin) &&
       (pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                           (&this->buffer,(long)(err._524_4_ + -1)), *pcVar5 == '\r')) {
      pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->buffer,(long)(err._524_4_ + -1));
      *pcVar5 = '\0';
    }
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->buffer);
    this_local = (LineReader *)(pcVar3 + this->data_begin);
    this->data_begin = err._524_4_ + 1;
  }
  return (char *)this_local;
}

Assistant:

char*next_line(){
                        if(data_begin == data_end)
                                return 0;

                        ++file_line;

                        assert(data_begin < data_end);
                        assert(data_end <= block_len*2);

                        if(data_begin >= block_len){
                                std::memcpy(buffer.get(), buffer.get()+block_len, block_len);
                                data_begin -= block_len;
                                data_end -= block_len;
                                if(reader.is_valid())
                                {
                                        data_end += reader.finish_read();
                                        std::memcpy(buffer.get()+block_len, buffer.get()+2*block_len, block_len);
                                        reader.start_read(buffer.get() + 2*block_len, block_len);
                                }
                        }

                        int line_end = data_begin;
                        while(buffer[line_end] != '\n' && line_end != data_end){
                                ++line_end;
                        }

                        if(line_end - data_begin + 1 > block_len){
                                error::line_length_limit_exceeded err;
                                err.set_file_name(file_name);
                                err.set_file_line(file_line);
                                throw err;
                        }

                        if(buffer[line_end] == '\n'){
                                buffer[line_end] = '\0';
                        }else{
                                // some files are missing the newline at the end of the
                                // last line
                                ++data_end;
                                buffer[line_end] = '\0';
                        }

                        // handle windows \r\n-line breaks
                        if(line_end != data_begin && buffer[line_end-1] == '\r')
                                buffer[line_end-1] = '\0';

                        char*ret = buffer.get() + data_begin;
                        data_begin = line_end+1;
                        return ret;
                }